

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec3.cpp
# Opt level: O1

Vec3 OpenSteer::randomVectorOnUnitRadiusXZDisk(void)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Vec3 VVar5;
  
  do {
    iVar1 = rand();
    fVar3 = (float)iVar1 * 4.656613e-10 + (float)iVar1 * 4.656613e-10 + -1.0;
    iVar1 = rand();
    fVar4 = (float)iVar1 * 4.656613e-10 + (float)iVar1 * 4.656613e-10 + -1.0;
    fVar2 = fVar4 * fVar4 + fVar3 * fVar3 + 0.0;
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
  } while (1.0 <= fVar2);
  VVar5.y = 0.0;
  VVar5.x = fVar3;
  VVar5.z = fVar4;
  return VVar5;
}

Assistant:

OpenSteer::Vec3 
OpenSteer::randomVectorOnUnitRadiusXZDisk (void)
{
    Vec3 v;

    do
    {
        v.set ((frandom01()*2) - 1,
               0,
               (frandom01()*2) - 1);
    }
    while (v.length() >= 1);

    return v;
}